

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

send_result_t
zmq::send_multipart<std::forward_list<zmq::message_t,std::allocator<zmq::message_t>>&,void>
          (socket_ref s,forward_list<zmq::message_t,_std::allocator<zmq::message_t>_> *msgs,
          send_flags flags)

{
  _Fwd_list_iterator<zmq::message_t> _Var1;
  size_t in_RCX;
  undefined4 in_register_00000014;
  ulong uVar2;
  ulong extraout_RDX;
  undefined8 uVar3;
  _Storage<unsigned_long,_true> _Var4;
  int in_R8D;
  _Fwd_list_iterator<zmq::message_t> __x;
  send_result_t sVar5;
  socket_ref s_local;
  
  uVar2 = CONCAT44(in_register_00000014,flags);
  _Var4._M_value = 0;
  __x._M_node = (msgs->super__Fwd_list_base<zmq::message_t,_std::allocator<zmq::message_t>_>).
                _M_impl._M_head._M_next;
  s_local.super_socket_base._handle = s.super_socket_base._handle;
  do {
    if (__x._M_node == (_Fwd_list_node_base *)0x0) {
      uVar3 = CONCAT71((int7)(uVar2 >> 8),1);
LAB_001420a0:
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var4._M_value;
      return (send_result_t)
             sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    _Var1 = std::next<std::_Fwd_list_iterator<zmq::message_t>>(__x,1);
    detail::socket_base::send
              (&s_local.super_socket_base,(int)__x._M_node + 8,
               (void *)(ulong)((uint)(_Var1._M_node != (_Fwd_list_node_base *)0x0) * 2 | flags),
               in_RCX,in_R8D);
    if ((extraout_RDX & 1) == 0) {
      if (__x._M_node !=
          (msgs->super__Fwd_list_base<zmq::message_t,_std::allocator<zmq::message_t>_>)._M_impl.
          _M_head._M_next) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::forward_list<zmq::message_t> &]"
                     );
      }
      uVar3 = 0;
      goto LAB_001420a0;
    }
    _Var4._M_value = _Var4._M_value + 1;
    uVar2 = extraout_RDX;
    __x = _Var1;
  } while( true );
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}